

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

IntRect __thiscall sf::RenderTarget::getViewport(RenderTarget *this,View *view)

{
  uint uVar1;
  ulong uVar2;
  FloatRect *pFVar3;
  View *in_RSI;
  long *in_RDI;
  FloatRect *viewport;
  float height;
  float width;
  IntRect local_10;
  
  uVar1 = (**(code **)(*in_RDI + 0x10))();
  uVar2 = (**(code **)(*in_RDI + 0x10))();
  pFVar3 = View::getViewport(in_RSI);
  Rect<int>::Rect(&local_10,(int)((float)uVar1 * pFVar3->left + 0.5),
                  (int)((float)(uVar2 >> 0x20) * pFVar3->top + 0.5),
                  (int)((float)uVar1 * pFVar3->width + 0.5),
                  (int)((float)(uVar2 >> 0x20) * pFVar3->height + 0.5));
  return local_10;
}

Assistant:

IntRect RenderTarget::getViewport(const View& view) const
{
    float width  = static_cast<float>(getSize().x);
    float height = static_cast<float>(getSize().y);
    const FloatRect& viewport = view.getViewport();

    return IntRect(static_cast<int>(0.5f + width  * viewport.left),
                   static_cast<int>(0.5f + height * viewport.top),
                   static_cast<int>(0.5f + width  * viewport.width),
                   static_cast<int>(0.5f + height * viewport.height));
}